

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PlatformIsAppleIos(cmMakefile *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string sdkRoot;
  string embedded [6];
  allocator local_15c;
  allocator local_15b;
  allocator local_15a;
  allocator local_159;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [40];
  
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_f8,"CMAKE_OSX_SYSROOT",(allocator *)&local_118);
  GetSafeDefinition(this,&local_f8);
  std::__cxx11::string::assign((char *)&local_158);
  std::__cxx11::string::~string((string *)&local_f8);
  cmsys::SystemTools::LowerCase(&local_f8,&local_158);
  std::__cxx11::string::operator=((string *)&local_158,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  __rhs = &local_f8;
  std::__cxx11::string::string((string *)__rhs,"appletvos",(allocator *)&local_118);
  std::__cxx11::string::string(local_d8,"appletvsimulator",(allocator *)&local_138);
  std::__cxx11::string::string(local_b8,"iphoneos",&local_15c);
  std::__cxx11::string::string(local_98,"iphonesimulator",&local_159);
  std::__cxx11::string::string(local_78,"watchos",&local_15a);
  std::__cxx11::string::string(local_58,"watchsimulator",&local_15b);
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 6) break;
    lVar3 = std::__cxx11::string::find((string *)&local_158,(ulong)__rhs);
    if (lVar3 == 0) break;
    std::__cxx11::string::string((string *)&local_138,"/",&local_15c);
    std::operator+(&local_118,&local_138,__rhs);
    lVar3 = std::__cxx11::string::find((string *)&local_158,(ulong)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    __rhs = __rhs + 1;
    uVar1 = uVar2 + 1;
  } while (lVar3 == -1);
  lVar3 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f8._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&local_158);
  return uVar2 < 6;
}

Assistant:

bool cmMakefile::PlatformIsAppleIos() const
{
  std::string sdkRoot;
  sdkRoot = this->GetSafeDefinition("CMAKE_OSX_SYSROOT");
  sdkRoot = cmSystemTools::LowerCase(sdkRoot);

  const std::string embedded[] = {
    "appletvos",       "appletvsimulator", "iphoneos",
    "iphonesimulator", "watchos",          "watchsimulator",
  };

  for (size_t i = 0; i < sizeof(embedded) / sizeof(embedded[0]); ++i) {
    if (sdkRoot.find(embedded[i]) == 0 ||
        sdkRoot.find(std::string("/") + embedded[i]) != std::string::npos) {
      return true;
    }
  }

  return false;
}